

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<float> min,WrappedFloatType<float> max,float gridSize)

{
  double __y;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  WrappedFloatType<float> WVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  deRandom rnd;
  int local_d0;
  int local_cc;
  deRandom local_40;
  
  iVar9 = componentCount * 4;
  if (stride != 0) {
    iVar9 = stride;
  }
  iVar8 = iVar9 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar8 = 0;
  }
  pcVar5 = (char *)operator_new__((long)(iVar8 * count + offset));
  deRandom_init(&local_40,seed);
  if ((primitive == PRIMITIVE_TRIANGLES) && (0 < count)) {
    fVar18 = max.m_value - min.m_value;
    uVar10 = -(uint)(-fVar18 <= fVar18);
    fVar15 = (float)(~uVar10 & (uint)-fVar18 | uVar10 & (uint)fVar18) * gridSize;
    fVar19 = 4.0;
    if (4.0 <= fVar15) {
      fVar19 = fVar15;
    }
    __y = (double)fVar19;
    local_cc = 8;
    local_d0 = 0xc;
    uVar7 = 0;
    do {
      uVar10 = 0;
      while( true ) {
        WVar12.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar15 = deRandom_getFloat(&local_40);
          WVar12.m_value = fVar15 * fVar18 + min.m_value;
        }
        dVar1 = fmod((double)WVar12.m_value,__y);
        fVar16 = WVar12.m_value - (float)dVar1;
        fVar15 = fVar19;
        if (fVar19 <= ABS(max.m_value - fVar16)) {
          fVar15 = deRandom_getFloat(&local_40);
          fVar15 = (ABS(max.m_value - fVar16) - fVar19) * fVar15 + fVar19;
        }
        dVar1 = fmod((double)fVar15,__y);
        WVar12.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar13 = deRandom_getFloat(&local_40);
          WVar12.m_value = fVar13 * fVar18 + min.m_value;
        }
        dVar2 = fmod((double)WVar12.m_value,__y);
        fVar17 = WVar12.m_value - (float)dVar2;
        fVar13 = fVar19;
        if (fVar19 <= ABS(max.m_value - fVar17)) {
          fVar13 = deRandom_getFloat(&local_40);
          fVar13 = (ABS(max.m_value - fVar17) - fVar19) * fVar13 + fVar19;
        }
        dVar2 = fmod((double)fVar13,__y);
        fVar20 = 0.0;
        if (2 < componentCount) {
          WVar12.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar20 = deRandom_getFloat(&local_40);
            WVar12.m_value = fVar20 * fVar18 + min.m_value;
          }
          dVar3 = fmod((double)WVar12.m_value,__y);
          fVar20 = WVar12.m_value - (float)dVar3;
        }
        fVar21 = 1.0;
        if (3 < componentCount) {
          WVar12.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar21 = deRandom_getFloat(&local_40);
            WVar12.m_value = fVar21 * fVar18 + min.m_value;
          }
          dVar3 = fmod((double)WVar12.m_value,__y);
          fVar21 = WVar12.m_value - (float)dVar3;
        }
        if ((componentCount < 3) ||
           (((fVar14 = (fVar15 - (float)dVar1) + fVar20, uVar11 = -(uint)(-fVar14 <= fVar14),
             fVar19 <= (float)(~uVar11 & (uint)-fVar14 | (uint)fVar14 & uVar11) &&
             (fVar14 = (fVar13 - (float)dVar2) + fVar21, uVar11 = -(uint)(-fVar14 <= fVar14),
             fVar19 <= (float)(~uVar11 & (uint)-fVar14 | (uint)fVar14 & uVar11))) || (2 < uVar10))))
        break;
        uVar10 = uVar10 + 1;
      }
      iVar4 = iVar8 * (int)uVar7;
      *(float *)(pcVar5 + (long)iVar4 + (long)offset) = fVar16;
      *(float *)(pcVar5 + (long)(iVar4 + 4) + (long)offset) = fVar17;
      fVar15 = (fVar15 - (float)dVar1) + fVar16;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9) + (long)offset) = fVar15;
      *(float *)(pcVar5 + (long)(iVar4 + 4 + iVar9) + (long)offset) = fVar17;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9 * 2) + (long)offset) = fVar16;
      fVar13 = (fVar13 - (float)dVar2) + fVar17;
      *(float *)(pcVar5 + (long)(iVar4 + 4 + iVar9 * 2) + (long)offset) = fVar13;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9 * 3) + (long)offset) = fVar16;
      *(float *)(pcVar5 + (long)(iVar4 + 4 + iVar9 * 3) + (long)offset) = fVar13;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9 * 4) + (long)offset) = fVar15;
      *(float *)(pcVar5 + (long)(iVar4 + 4 + iVar9 * 4) + (long)offset) = fVar17;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9 * 5) + (long)offset) = fVar15;
      *(float *)(pcVar5 + (long)(iVar4 + iVar9 * 5 + 4) + (long)offset) = fVar13;
      if (2 < componentCount) {
        lVar6 = 6;
        iVar4 = local_cc;
        do {
          *(float *)(pcVar5 + (long)iVar4 + (long)offset) = fVar20;
          iVar4 = iVar4 + iVar9;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      if (3 < componentCount) {
        lVar6 = 6;
        iVar4 = local_d0;
        do {
          *(float *)(pcVar5 + (long)iVar4 + (long)offset) = fVar21;
          iVar4 = iVar4 + iVar9;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      local_cc = local_cc + iVar8;
      local_d0 = local_d0 + iVar8;
    } while (uVar7 != (uint)count);
  }
  return pcVar5;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}